

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O2

double __thiscall
units::detail::extraValidConversions<units::unit,units::unit>
          (detail *this,double val,unit *start,unit *result)

{
  uint extraout_var;
  uint extraout_var_00;
  double dVar1;
  double in_XMM1_Qa;
  
  unit::pow((unit *)&units::m,val,in_XMM1_Qa);
  if ((((extraout_var ^ *(uint *)(this + 4)) & 0xfffffff) == 0) &&
     (((uint)start->base_units_ & 0xfffffff) == 0x1e2)) {
    dVar1 = (double)*(float *)this * val * 40984840.36367558;
  }
  else {
    if ((*(uint *)(this + 4) & 0xfffffff) != 0x1e2) {
      return NAN;
    }
    unit::pow((unit *)&units::m,NAN,in_XMM1_Qa);
    if (((extraout_var_00 ^ (uint)start->base_units_) & 0xfffffff) != 0) {
      return NAN;
    }
    dVar1 = ((double)*(float *)this * val) / 40984840.36367558;
  }
  return dVar1 / (double)start->multiplier_;
}

Assistant:

inline double
        extraValidConversions(double val, const UX& start, const UX2& result)
    {
        if (start.has_same_base(m.pow(3)) && result.has_same_base(J)) {
            // volume to scf or scm
            return val * start.multiplier() *
                precise::energy::scm.multiplier() / result.multiplier();
        }
        if (start.has_same_base(J) && result.has_same_base(m.pow(3))) {
            // volume to scf or scm
            return val * start.multiplier() /
                precise::energy::scm.multiplier() / result.multiplier();
        }
        return constants::invalid_conversion;
    }